

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

pdf_obj * pdf_new_array(hd_context *ctx,pdf_document *doc,int initialcap)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  pdf_obj *p;
  void *pvVar3;
  pdf_obj pVar4;
  long lVar5;
  
  p = (pdf_obj *)hd_malloc(ctx,0x28);
  p->refs = 1;
  p->kind = 'a';
  p->flags = '\0';
  *(pdf_document **)(p + 2) = doc;
  *(undefined8 *)(p + 4) = 0;
  pVar4.refs = 6;
  pVar4.kind = '\0';
  pVar4.flags = '\0';
  if (1 < initialcap) {
    pVar4 = (pdf_obj)initialcap;
  }
  p[6] = pVar4;
  iVar2 = hd_push_try(ctx);
  if (iVar2 != 0) {
    iVar2 = __sigsetjmp(ctx->error->top->buffer,0);
    if (iVar2 == 0) {
      pvVar3 = hd_malloc_array(ctx,(long)(int)p[6],8);
      *(void **)(p + 8) = pvVar3;
    }
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    pVar4 = p[6];
    if (0 < (long)(int)pVar4) {
      lVar5 = 0;
      do {
        *(undefined8 *)(*(long *)(p + 8) + lVar5 * 8) = 0;
        lVar5 = lVar5 + 1;
      } while ((int)pVar4 != lVar5);
    }
    return p;
  }
  hd_free(ctx,p);
  hd_rethrow(ctx);
}

Assistant:

pdf_obj *
pdf_new_array(hd_context *ctx, pdf_document *doc, int initialcap)
{
    pdf_obj_array *obj;
    int i;

    obj = Memento_label(hd_malloc(ctx, sizeof(pdf_obj_array)), "pdf_obj(array)");
    obj->super.refs = 1;
    obj->super.kind = PDF_ARRAY;
    obj->super.flags = 0;
    obj->doc = doc;
    obj->parent_num = 0;

    obj->len = 0;
    obj->cap = initialcap > 1 ? initialcap : 6;

    hd_try(ctx)
    {
        obj->items = Memento_label(hd_malloc_array(ctx, obj->cap, sizeof(pdf_obj*)), "pdf_obj(array items)");
    }
    hd_catch(ctx)
    {
        hd_free(ctx, obj);
        hd_rethrow(ctx);
    }
    for (i = 0; i < obj->cap; i++)
        obj->items[i] = NULL;

    return &obj->super;
}